

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::swap(DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
       *this,DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
             *RHS)

{
  uint uVar1;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar2;
  
  pDVar2 = this->Buckets;
  this->Buckets = RHS->Buckets;
  RHS->Buckets = pDVar2;
  uVar1 = this->NumEntries;
  this->NumEntries = RHS->NumEntries;
  RHS->NumEntries = uVar1;
  uVar1 = this->NumTombstones;
  this->NumTombstones = RHS->NumTombstones;
  RHS->NumTombstones = uVar1;
  uVar1 = this->NumBuckets;
  this->NumBuckets = RHS->NumBuckets;
  RHS->NumBuckets = uVar1;
  return;
}

Assistant:

void swap(DenseMap& RHS) {
    this->incrementEpoch();
    RHS.incrementEpoch();
    std::swap(Buckets, RHS.Buckets);
    std::swap(NumEntries, RHS.NumEntries);
    std::swap(NumTombstones, RHS.NumTombstones);
    std::swap(NumBuckets, RHS.NumBuckets);
  }